

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

void __thiscall
nigel::Preprocessor::processFile
          (Preprocessor *this,CodeBase *base,shared_ptr<boost::filesystem::path> *path,
          vector<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>
          *result,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *definitions,size_t *ifdefCount,bool *ignoreifdef,size_t *posAtIgnore)

{
  shared_ptr<boost::filesystem::path> *this_00;
  size_type *psVar1;
  size_t sVar2;
  bool bVar3;
  element_type *peVar4;
  string *psVar5;
  istream *piVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  mapped_type *pmVar10;
  bool local_9f2;
  shared_ptr<boost::filesystem::path> local_9e0;
  undefined1 local_9d0 [63];
  allocator local_991;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  allocator local_969;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_968;
  allocator local_941;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_940;
  allocator local_919;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_918;
  string local_8f8;
  allocator local_8d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d0;
  allocator local_8a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8;
  reference local_888;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *s;
  iterator __end5;
  iterator __begin5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range5;
  allocator local_841;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_840;
  shared_ptr<boost::filesystem::path> local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_810;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  undefined1 local_770 [24];
  key_type local_758;
  allocator local_731;
  key_type local_730;
  allocator local_709;
  key_type local_708;
  allocator local_6e1;
  key_type local_6e0;
  shared_ptr<boost::filesystem::path> local_6c0;
  undefined1 local_6b0 [48];
  ulong local_680;
  size_t pos_8;
  String def_1;
  String identifier_4;
  size_t pos_7;
  undefined1 local_620 [32];
  path local_600;
  path local_5e0;
  string_type local_5c0;
  undefined1 local_5a0 [8];
  path subPath;
  String filename;
  undefined1 local_550 [24];
  String errorInfo_1;
  size_t pos_6;
  undefined1 local_508 [24];
  String errorInfo;
  size_t pos_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [8];
  String identifier_3;
  size_t pos_4;
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [8];
  String identifier_2;
  size_t pos_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [8];
  String identifier_1;
  size_t pos_2;
  undefined1 local_358 [48];
  ulong local_328;
  size_t pos_1;
  String def;
  String identifier;
  size_t pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  undefined1 local_2a8 [64];
  size_t local_268;
  size_t lineCount;
  String str;
  ifstream filestream;
  size_t *ifdefCount_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *definitions_local;
  vector<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_> *result_local;
  shared_ptr<boost::filesystem::path> *path_local;
  CodeBase *base_local;
  Preprocessor *this_local;
  
  peVar4 = std::
           __shared_ptr_access<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)path);
  psVar5 = boost::filesystem::path::string_abi_cxx11_(peVar4);
  std::ifstream::ifstream((void *)((long)&str.field_2 + 8),(string *)psVar5,_S_bin);
  std::__cxx11::string::string((string *)&lineCount);
  local_268 = 0;
  while( true ) {
    bVar3 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&str.field_2 + *(long *)(str.field_2._8_8_ + -0x18) + 8));
    local_9f2 = false;
    if (bVar3) {
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)(str.field_2._M_local_buf + 8),(string *)&lineCount);
      local_9f2 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
    }
    if (local_9f2 == false) break;
    local_268 = local_268 + 1;
    while( true ) {
      lVar7 = std::__cxx11::string::size();
      bVar3 = false;
      if (lVar7 != 0) {
        pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)&lineCount);
        bVar3 = true;
        if (*pcVar8 != ' ') {
          pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)&lineCount);
          bVar3 = true;
          if (*pcVar8 != '\t') {
            pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)&lineCount);
            bVar3 = true;
            if (*pcVar8 != '\r') {
              pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)&lineCount);
              bVar3 = *pcVar8 == '\n';
            }
          }
        }
      }
      if (!bVar3) break;
      std::__cxx11::string::substr((ulong)(local_2a8 + 0x10),(ulong)&lineCount);
      std::__cxx11::string::operator=((string *)&lineCount,(string *)(local_2a8 + 0x10));
      std::__cxx11::string::~string((string *)(local_2a8 + 0x10));
    }
    lVar7 = std::__cxx11::string::size();
    if (lVar7 != 0) {
      pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)&lineCount);
      if (*pcVar8 == '#') {
        uVar9 = std::__cxx11::string::size();
        if (uVar9 < 2) {
          std::make_shared<std::__cxx11::string,std::__cxx11::string&>(&local_810);
          sVar2 = local_268;
          std::shared_ptr<boost::filesystem::path>::shared_ptr(&local_820,path);
          BuilderExecutable::generateNotification
                    (&this->super_BuilderExecutable,warn_emptyDirective,
                     (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_810,sVar2,&local_820);
          std::shared_ptr<boost::filesystem::path>::~shared_ptr(&local_820);
          std::
          shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_810);
        }
        else if ((*ignoreifdef & 1U) == 0) {
          lVar7 = std::__cxx11::string::find((char *)&lineCount,0x2726c2);
          if (lVar7 == 1) {
            uVar9 = std::__cxx11::string::size();
            if (uVar9 < 9) {
              std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_358);
              sVar2 = local_268;
              std::shared_ptr<boost::filesystem::path>::shared_ptr
                        ((shared_ptr<boost::filesystem::path> *)&pos_2,path);
              BuilderExecutable::generateNotification
                        (&this->super_BuilderExecutable,err_incompleteDefineDirective,
                         (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_358,sVar2,(shared_ptr<boost::filesystem::path> *)&pos_2);
              std::shared_ptr<boost::filesystem::path>::~shared_ptr
                        ((shared_ptr<boost::filesystem::path> *)&pos_2);
              std::
              shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_358);
            }
            else {
              identifier.field_2._8_8_ = std::__cxx11::string::find((char)&lineCount,10);
              uVar9 = std::__cxx11::string::find((char)&lineCount,0xd);
              if (uVar9 < (ulong)identifier.field_2._8_8_) {
                identifier.field_2._8_8_ = std::__cxx11::string::find((char)&lineCount,0xd);
              }
              uVar9 = std::__cxx11::string::find((char)&lineCount,0x20);
              if (uVar9 < (ulong)identifier.field_2._8_8_) {
                std::__cxx11::string::find((char)&lineCount,0x20);
              }
              std::__cxx11::string::substr((ulong)((long)&def.field_2 + 8),(ulong)&lineCount);
              std::__cxx11::string::string((string *)&pos_1);
              uVar9 = std::__cxx11::string::size();
              lVar7 = std::__cxx11::string::size();
              if (lVar7 + 9U < uVar9) {
                local_328 = std::__cxx11::string::find((char)&lineCount,10);
                uVar9 = std::__cxx11::string::find((char)&lineCount,0xd);
                if (uVar9 < local_328) {
                  local_328 = std::__cxx11::string::find((char)&lineCount,0xd);
                }
                std::__cxx11::string::size();
                std::__cxx11::string::size();
                std::__cxx11::string::substr((ulong)(local_358 + 0x10),(ulong)&lineCount);
                std::__cxx11::string::operator=((string *)&pos_1,(string *)(local_358 + 0x10));
                std::__cxx11::string::~string((string *)(local_358 + 0x10));
              }
              pmVar10 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](definitions,(key_type *)((long)&def.field_2 + 8));
              std::__cxx11::string::operator=((string *)pmVar10,(string *)&pos_1);
              std::__cxx11::string::~string((string *)&pos_1);
              std::__cxx11::string::~string((string *)(def.field_2._M_local_buf + 8));
            }
          }
          else {
            lVar7 = std::__cxx11::string::find((char *)&lineCount,0x2726c9);
            if (lVar7 == 1) {
              uVar9 = std::__cxx11::string::size();
              if (uVar9 < 8) {
                std::make_shared<std::__cxx11::string,std::__cxx11::string&>(&local_3d0);
                sVar2 = local_268;
                std::shared_ptr<boost::filesystem::path>::shared_ptr
                          ((shared_ptr<boost::filesystem::path> *)&pos_3,path);
                BuilderExecutable::generateNotification
                          (&this->super_BuilderExecutable,err_incompleteUndefineDirective,
                           (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_3d0,sVar2,(shared_ptr<boost::filesystem::path> *)&pos_3);
                std::shared_ptr<boost::filesystem::path>::~shared_ptr
                          ((shared_ptr<boost::filesystem::path> *)&pos_3);
                std::
                shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_3d0);
              }
              else {
                identifier_1.field_2._8_8_ = std::__cxx11::string::find((char)&lineCount,10);
                uVar9 = std::__cxx11::string::find((char)&lineCount,0xd);
                if (uVar9 < (ulong)identifier_1.field_2._8_8_) {
                  identifier_1.field_2._8_8_ = std::__cxx11::string::find((char)&lineCount,0xd);
                }
                std::__cxx11::string::substr((ulong)local_390,(ulong)&lineCount);
                local_3a0._8_8_ =
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::find(definitions,(key_type *)local_390);
                local_3a0._0_8_ =
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::end(definitions);
                bVar3 = std::operator!=((_Self *)(local_3a0 + 8),(_Self *)local_3a0);
                if (bVar3) {
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::erase(definitions,(key_type *)local_390);
                }
                else {
                  std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_3b0);
                  sVar2 = local_268;
                  std::shared_ptr<boost::filesystem::path>::shared_ptr
                            ((shared_ptr<boost::filesystem::path> *)&local_3d0.field_2,path);
                  BuilderExecutable::generateNotification
                            (&this->super_BuilderExecutable,
                             warn_undefinedIdentifiernAtUndefDirective,
                             (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_3b0,sVar2,
                             (shared_ptr<boost::filesystem::path> *)&local_3d0.field_2);
                  std::shared_ptr<boost::filesystem::path>::~shared_ptr
                            ((shared_ptr<boost::filesystem::path> *)&local_3d0.field_2);
                  std::
                  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_3b0);
                }
                std::__cxx11::string::~string((string *)local_390);
              }
            }
            else {
              lVar7 = std::__cxx11::string::find((char *)&lineCount,0x2726a8);
              if (lVar7 == 1) {
                uVar9 = std::__cxx11::string::size();
                if (uVar9 < 8) {
                  std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_428);
                  sVar2 = local_268;
                  std::shared_ptr<boost::filesystem::path>::shared_ptr
                            ((shared_ptr<boost::filesystem::path> *)&pos_4,path);
                  BuilderExecutable::generateNotification
                            (&this->super_BuilderExecutable,err_elseifWithoutIfdef,
                             (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_428,sVar2,(shared_ptr<boost::filesystem::path> *)&pos_4);
                  std::shared_ptr<boost::filesystem::path>::~shared_ptr
                            ((shared_ptr<boost::filesystem::path> *)&pos_4);
                  std::
                  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_428);
                }
                else {
                  identifier_2.field_2._8_8_ = std::__cxx11::string::find((char)&lineCount,10);
                  uVar9 = std::__cxx11::string::find((char)&lineCount,0xd);
                  if (uVar9 < (ulong)identifier_2.field_2._8_8_) {
                    identifier_2.field_2._8_8_ = std::__cxx11::string::find((char)&lineCount,0xd);
                  }
                  std::__cxx11::string::substr((ulong)local_408,(ulong)&lineCount);
                  *ifdefCount = *ifdefCount + 1;
                  local_418._8_8_ =
                       std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::find(definitions,(key_type *)local_408);
                  local_418._0_8_ =
                       std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::end(definitions);
                  bVar3 = std::operator==((_Self *)(local_418 + 8),(_Self *)local_418);
                  if (bVar3) {
                    *ignoreifdef = true;
                    *posAtIgnore = *ifdefCount;
                  }
                  std::__cxx11::string::~string((string *)local_408);
                }
              }
              else {
                lVar7 = std::__cxx11::string::find((char *)&lineCount,0x2726ae);
                if (lVar7 == 1) {
                  uVar9 = std::__cxx11::string::size();
                  if (uVar9 < 9) {
                    std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_480);
                    sVar2 = local_268;
                    std::shared_ptr<boost::filesystem::path>::shared_ptr
                              ((shared_ptr<boost::filesystem::path> *)&local_4a0.field_2,path);
                    BuilderExecutable::generateNotification
                              (&this->super_BuilderExecutable,err_elseifWithoutIfdef,
                               (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_480,sVar2,
                               (shared_ptr<boost::filesystem::path> *)&local_4a0.field_2);
                    std::shared_ptr<boost::filesystem::path>::~shared_ptr
                              ((shared_ptr<boost::filesystem::path> *)&local_4a0.field_2);
                    std::
                    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)local_480);
                  }
                  else {
                    identifier_3.field_2._8_8_ = std::__cxx11::string::find((char)&lineCount,10);
                    uVar9 = std::__cxx11::string::find((char)&lineCount,0xd);
                    if (uVar9 < (ulong)identifier_3.field_2._8_8_) {
                      identifier_3.field_2._8_8_ = std::__cxx11::string::find((char)&lineCount,0xd);
                    }
                    std::__cxx11::string::substr((ulong)local_460,(ulong)&lineCount);
                    *ifdefCount = *ifdefCount + 1;
                    local_470._8_8_ =
                         std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::find(definitions,(key_type *)local_460);
                    local_470._0_8_ =
                         std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::end(definitions);
                    bVar3 = std::operator!=((_Self *)(local_470 + 8),(_Self *)local_470);
                    if (bVar3) {
                      *ignoreifdef = true;
                      *posAtIgnore = *ifdefCount;
                    }
                    std::__cxx11::string::~string((string *)local_460);
                  }
                }
                else {
                  lVar7 = std::__cxx11::string::find((char *)&lineCount,0x2726b5);
                  if (lVar7 == 1) {
                    if (*ifdefCount == 0) {
                      std::make_shared<std::__cxx11::string,std::__cxx11::string&>(&local_4a0);
                      sVar2 = local_268;
                      std::shared_ptr<boost::filesystem::path>::shared_ptr
                                ((shared_ptr<boost::filesystem::path> *)&local_4c0.field_2,path);
                      BuilderExecutable::generateNotification
                                (&this->super_BuilderExecutable,err_elseifWithoutIfdef,
                                 (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&local_4a0,sVar2,
                                 (shared_ptr<boost::filesystem::path> *)&local_4c0.field_2);
                      std::shared_ptr<boost::filesystem::path>::~shared_ptr
                                ((shared_ptr<boost::filesystem::path> *)&local_4c0.field_2);
                      std::
                      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&local_4a0);
                    }
                    else if ((*ignoreifdef & 1U) == 0) {
                      *ignoreifdef = true;
                      *posAtIgnore = *ifdefCount;
                    }
                    else {
                      *ignoreifdef = false;
                    }
                  }
                  else {
                    lVar7 = std::__cxx11::string::find((char *)&lineCount,0x2726bc);
                    if (lVar7 == 1) {
                      if (*ifdefCount == 0) {
                        std::make_shared<std::__cxx11::string,std::__cxx11::string&>(&local_4c0);
                        sVar2 = local_268;
                        std::shared_ptr<boost::filesystem::path>::shared_ptr
                                  ((shared_ptr<boost::filesystem::path> *)&pos_5,path);
                        BuilderExecutable::generateNotification
                                  (&this->super_BuilderExecutable,err_endifWithoutIfdef,
                                   (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&local_4c0,sVar2,(shared_ptr<boost::filesystem::path> *)&pos_5
                                  );
                        std::shared_ptr<boost::filesystem::path>::~shared_ptr
                                  ((shared_ptr<boost::filesystem::path> *)&pos_5);
                        std::
                        shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&local_4c0);
                      }
                      else {
                        if (*posAtIgnore == *ifdefCount) {
                          *ignoreifdef = false;
                        }
                        *ifdefCount = *ifdefCount - 1;
                      }
                    }
                    else {
                      lVar7 = std::__cxx11::string::find((char *)&lineCount,0x270540);
                      if (lVar7 == 1) {
                        errorInfo.field_2._8_8_ = std::__cxx11::string::find((char)&lineCount,10);
                        uVar9 = std::__cxx11::string::find((char)&lineCount,0xd);
                        if (uVar9 < (ulong)errorInfo.field_2._8_8_) {
                          errorInfo.field_2._8_8_ = std::__cxx11::string::find((char)&lineCount,0xd)
                          ;
                        }
                        std::__cxx11::string::substr((ulong)(local_508 + 0x10),(ulong)&lineCount);
                        std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_508);
                        sVar2 = local_268;
                        std::shared_ptr<boost::filesystem::path>::shared_ptr
                                  ((shared_ptr<boost::filesystem::path> *)&pos_6,path);
                        BuilderExecutable::generateNotification
                                  (&this->super_BuilderExecutable,err_errorDirective,
                                   (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)local_508,sVar2,(shared_ptr<boost::filesystem::path> *)&pos_6)
                        ;
                        std::shared_ptr<boost::filesystem::path>::~shared_ptr
                                  ((shared_ptr<boost::filesystem::path> *)&pos_6);
                        std::
                        shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)local_508);
                        std::__cxx11::string::~string((string *)(local_508 + 0x10));
                      }
                      else {
                        lVar7 = std::__cxx11::string::find((char *)&lineCount,0x2705e6);
                        if (lVar7 == 1) {
                          errorInfo_1.field_2._8_8_ =
                               std::__cxx11::string::find((char)&lineCount,10);
                          uVar9 = std::__cxx11::string::find((char)&lineCount,0xd);
                          if (uVar9 < (ulong)errorInfo_1.field_2._8_8_) {
                            errorInfo_1.field_2._8_8_ =
                                 std::__cxx11::string::find((char)&lineCount,0xd);
                          }
                          std::__cxx11::string::substr((ulong)(local_550 + 0x10),(ulong)&lineCount);
                          std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_550);
                          sVar2 = local_268;
                          this_00 = (shared_ptr<boost::filesystem::path> *)
                                    ((long)&filename.field_2 + 8);
                          std::shared_ptr<boost::filesystem::path>::shared_ptr(this_00,path);
                          BuilderExecutable::generateNotification
                                    (&this->super_BuilderExecutable,warn_warningDirective,
                                     (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_550,sVar2,this_00);
                          std::shared_ptr<boost::filesystem::path>::~shared_ptr
                                    ((shared_ptr<boost::filesystem::path> *)
                                     ((long)&filename.field_2 + 8));
                          std::
                          shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)local_550);
                          std::__cxx11::string::~string((string *)(local_550 + 0x10));
                        }
                        else {
                          lVar7 = std::__cxx11::string::find((char *)&lineCount,0x2726cf);
                          if (lVar7 == 1) {
                            uVar9 = std::__cxx11::string::size();
                            if (uVar9 < 0xb) {
                              std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_620);
                              sVar2 = local_268;
                              std::shared_ptr<boost::filesystem::path>::shared_ptr
                                        ((shared_ptr<boost::filesystem::path> *)&pos_7,path);
                              BuilderExecutable::generateNotification
                                        (&this->super_BuilderExecutable,
                                         err_incompleteIncludeDirective,
                                         (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)local_620,sVar2,
                                         (shared_ptr<boost::filesystem::path> *)&pos_7);
                              std::shared_ptr<boost::filesystem::path>::~shared_ptr
                                        ((shared_ptr<boost::filesystem::path> *)&pos_7);
                              std::
                              shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             *)local_620);
                            }
                            else {
                              std::__cxx11::string::find((char)&lineCount,0x22);
                              std::__cxx11::string::substr
                                        ((ulong)((long)&subPath.m_pathname.field_2 + 8),
                                         (ulong)&lineCount);
                              psVar1 = &subPath.m_pathname.field_2._M_allocated_capacity + 1;
                              std::__cxx11::string::find((char)psVar1,0x22);
                              std::__cxx11::string::substr((ulong)&local_5c0,(ulong)psVar1);
                              boost::filesystem::path::path((path *)local_5a0,&local_5c0);
                              std::__cxx11::string::~string((string *)&local_5c0);
                              peVar4 = std::
                                       __shared_ptr_access<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       ::operator->((
                                                  __shared_ptr_access<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)path);
                              bVar3 = boost::filesystem::path::has_parent_path(peVar4);
                              if (bVar3) {
                                std::
                                __shared_ptr_access<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)path);
                                boost::filesystem::path::parent_path();
                                boost::filesystem::absolute(&local_5e0,(path *)local_5a0,&local_600)
                                ;
                                boost::filesystem::path::operator=((path *)local_5a0,&local_5e0);
                                boost::filesystem::path::~path(&local_5e0);
                                boost::filesystem::path::~path(&local_600);
                              }
                              std::make_shared<boost::filesystem::path,boost::filesystem::path&>
                                        ((path *)(local_620 + 0x10));
                              processFile(this,base,
                                          (shared_ptr<boost::filesystem::path> *)(local_620 + 0x10),
                                          result,definitions,ifdefCount,ignoreifdef,posAtIgnore);
                              std::shared_ptr<boost::filesystem::path>::~shared_ptr
                                        ((shared_ptr<boost::filesystem::path> *)(local_620 + 0x10));
                              boost::filesystem::path::~path((path *)local_5a0);
                              std::__cxx11::string::~string
                                        ((string *)(subPath.m_pathname.field_2._M_local_buf + 8));
                            }
                          }
                          else {
                            lVar7 = std::__cxx11::string::find((char *)&lineCount,0x2726d7);
                            if (lVar7 == 1) {
                              uVar9 = std::__cxx11::string::size();
                              if (uVar9 < 9) {
                                std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                                          (&local_7b0);
                                sVar2 = local_268;
                                std::shared_ptr<boost::filesystem::path>::shared_ptr
                                          ((shared_ptr<boost::filesystem::path> *)&local_7d0.field_2
                                           ,path);
                                BuilderExecutable::generateNotification
                                          (&this->super_BuilderExecutable,err_incompletePragma,
                                           (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&local_7b0,sVar2,
                                           (shared_ptr<boost::filesystem::path> *)&local_7d0.field_2
                                          );
                                std::shared_ptr<boost::filesystem::path>::~shared_ptr
                                          ((shared_ptr<boost::filesystem::path> *)&local_7d0.field_2
                                          );
                                std::
                                shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               *)&local_7b0);
                              }
                              else {
                                identifier_4.field_2._8_8_ =
                                     std::__cxx11::string::find((char)&lineCount,10);
                                uVar9 = std::__cxx11::string::find((char)&lineCount,0xd);
                                if (uVar9 < (ulong)identifier_4.field_2._8_8_) {
                                  identifier_4.field_2._8_8_ =
                                       std::__cxx11::string::find((char)&lineCount,0xd);
                                }
                                uVar9 = std::__cxx11::string::find((char)&lineCount,0x20);
                                if (uVar9 < (ulong)identifier_4.field_2._8_8_) {
                                  std::__cxx11::string::find((char)&lineCount,0x20);
                                }
                                else {
                                  uVar9 = std::__cxx11::string::find((char)&lineCount,0x3d);
                                  if (uVar9 < (ulong)identifier_4.field_2._8_8_) {
                                    std::__cxx11::string::find((char)&lineCount,0x3d);
                                  }
                                }
                                std::__cxx11::string::substr
                                          ((ulong)((long)&def_1.field_2 + 8),(ulong)&lineCount);
                                std::__cxx11::string::string((string *)&pos_8);
                                uVar9 = std::__cxx11::string::size();
                                lVar7 = std::__cxx11::string::size();
                                if (lVar7 + 9U < uVar9) {
                                  local_680 = std::__cxx11::string::find((char)&lineCount,10);
                                  uVar9 = std::__cxx11::string::find((char)&lineCount,0xd);
                                  if (uVar9 < local_680) {
                                    local_680 = std::__cxx11::string::find((char)&lineCount,0xd);
                                  }
                                  std::__cxx11::string::size();
                                  std::__cxx11::string::size();
                                  std::__cxx11::string::substr
                                            ((ulong)(local_6b0 + 0x10),(ulong)&lineCount);
                                  std::__cxx11::string::operator=
                                            ((string *)&pos_8,(string *)(local_6b0 + 0x10));
                                  std::__cxx11::string::~string((string *)(local_6b0 + 0x10));
                                }
                                bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&def_1.field_2 + 8),"memmodel");
                                if (bVar3) {
                                  uVar9 = std::__cxx11::string::empty();
                                  if ((uVar9 & 1) == 0) {
                                    bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&pos_8,"fast");
                                    if (bVar3) {
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string
                                                ((string *)&local_6e0,"byte",&local_6e1);
                                      pmVar10 = std::
                                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                ::operator[](definitions,&local_6e0);
                                      std::__cxx11::string::operator=((string *)pmVar10,"fast byte")
                                      ;
                                      std::__cxx11::string::~string((string *)&local_6e0);
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)&local_6e1);
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string
                                                ((string *)&local_708,"int",&local_709);
                                      pmVar10 = std::
                                                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                ::operator[](definitions,&local_708);
                                      std::__cxx11::string::operator=((string *)pmVar10,"fast int");
                                      std::__cxx11::string::~string((string *)&local_708);
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)&local_709);
                                    }
                                    else {
                                      bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&pos_8,"norm");
                                      if (bVar3) {
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string
                                                  ((string *)&local_730,"byte",&local_731);
                                        pmVar10 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator[](definitions,&local_730);
                                        std::__cxx11::string::operator=
                                                  ((string *)pmVar10,"norm byte");
                                        std::__cxx11::string::~string((string *)&local_730);
                                        std::allocator<char>::~allocator
                                                  ((allocator<char> *)&local_731);
                                        std::allocator<char>::allocator();
                                        std::__cxx11::string::string
                                                  ((string *)&local_758,"int",
                                                   (allocator *)(local_770 + 0x17));
                                        pmVar10 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                  ::operator[](definitions,&local_758);
                                        std::__cxx11::string::operator=
                                                  ((string *)pmVar10,"norm int");
                                        std::__cxx11::string::~string((string *)&local_758);
                                        std::allocator<char>::~allocator
                                                  ((allocator<char> *)(local_770 + 0x17));
                                      }
                                      else {
                                        std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                                                  ((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_770);
                                        sVar2 = local_268;
                                        std::shared_ptr<boost::filesystem::path>::shared_ptr
                                                  ((shared_ptr<boost::filesystem::path> *)
                                                   &local_790.field_2,path);
                                        BuilderExecutable::generateNotification
                                                  (&this->super_BuilderExecutable,
                                                   err_unknownMemModelPragma,
                                                   (
                                                  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_770,sVar2,
                                                  (shared_ptr<boost::filesystem::path> *)
                                                  &local_790.field_2);
                                        std::shared_ptr<boost::filesystem::path>::~shared_ptr
                                                  ((shared_ptr<boost::filesystem::path> *)
                                                   &local_790.field_2);
                                        std::
                                        shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::~shared_ptr((
                                                  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_770);
                                      }
                                    }
                                  }
                                  else {
                                    std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_6b0);
                                    sVar2 = local_268;
                                    std::shared_ptr<boost::filesystem::path>::shared_ptr
                                              (&local_6c0,path);
                                    BuilderExecutable::generateNotification
                                              (&this->super_BuilderExecutable,
                                               err_incompleteMemModelPragma,
                                               (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)local_6b0,sVar2,&local_6c0);
                                    std::shared_ptr<boost::filesystem::path>::~shared_ptr
                                              (&local_6c0);
                                    std::
                                    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::~shared_ptr((
                                                  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)local_6b0);
                                  }
                                }
                                else {
                                  std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                                            (&local_790);
                                  sVar2 = local_268;
                                  std::shared_ptr<boost::filesystem::path>::shared_ptr
                                            ((shared_ptr<boost::filesystem::path> *)
                                             &local_7b0.field_2,path);
                                  BuilderExecutable::generateNotification
                                            (&this->super_BuilderExecutable,err_unknownPragma,
                                             (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&local_790,sVar2,
                                             (shared_ptr<boost::filesystem::path> *)
                                             &local_7b0.field_2);
                                  std::shared_ptr<boost::filesystem::path>::~shared_ptr
                                            ((shared_ptr<boost::filesystem::path> *)
                                             &local_7b0.field_2);
                                  std::
                                  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                 *)&local_790);
                                }
                                std::__cxx11::string::~string((string *)&pos_8);
                                std::__cxx11::string::~string
                                          ((string *)(def_1.field_2._M_local_buf + 8));
                              }
                            }
                            else {
                              bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&lineCount,"##");
                              if (((bVar3) ||
                                  (bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&lineCount,"#\r"), bVar3)) ||
                                 (bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&lineCount,"##\r"), bVar3)) {
                                std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                                          (&local_7d0);
                                sVar2 = local_268;
                                std::shared_ptr<boost::filesystem::path>::shared_ptr
                                          ((shared_ptr<boost::filesystem::path> *)&local_7f0.field_2
                                           ,path);
                                BuilderExecutable::generateNotification
                                          (&this->super_BuilderExecutable,warn_emptyDirective,
                                           (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&local_7d0,sVar2,
                                           (shared_ptr<boost::filesystem::path> *)&local_7f0.field_2
                                          );
                                std::shared_ptr<boost::filesystem::path>::~shared_ptr
                                          ((shared_ptr<boost::filesystem::path> *)&local_7f0.field_2
                                          );
                                std::
                                shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               *)&local_7d0);
                              }
                              else {
                                std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                                          (&local_7f0);
                                sVar2 = local_268;
                                std::shared_ptr<boost::filesystem::path>::shared_ptr
                                          ((shared_ptr<boost::filesystem::path> *)&local_810.field_2
                                           ,path);
                                BuilderExecutable::generateNotification
                                          (&this->super_BuilderExecutable,err_unknownDirective,
                                           (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&local_7f0,sVar2,
                                           (shared_ptr<boost::filesystem::path> *)&local_810.field_2
                                          );
                                std::shared_ptr<boost::filesystem::path>::~shared_ptr
                                          ((shared_ptr<boost::filesystem::path> *)&local_810.field_2
                                          );
                                std::
                                shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               *)&local_7f0);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else {
          lVar7 = std::__cxx11::string::find((char *)&lineCount,0x2726a8);
          if ((lVar7 == 1) ||
             (lVar7 = std::__cxx11::string::find((char *)&lineCount,0x2726ae), lVar7 == 1)) {
            *ifdefCount = *ifdefCount + 1;
          }
          lVar7 = std::__cxx11::string::find((char *)&lineCount,0x2726b5);
          if (lVar7 == 1) {
            if (*ifdefCount == 0) {
              std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2a8);
              sVar2 = local_268;
              std::shared_ptr<boost::filesystem::path>::shared_ptr
                        ((shared_ptr<boost::filesystem::path> *)&local_2c8.field_2,path);
              BuilderExecutable::generateNotification
                        (&this->super_BuilderExecutable,err_elseifWithoutIfdef,
                         (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_2a8,sVar2,
                         (shared_ptr<boost::filesystem::path> *)&local_2c8.field_2);
              std::shared_ptr<boost::filesystem::path>::~shared_ptr
                        ((shared_ptr<boost::filesystem::path> *)&local_2c8.field_2);
              std::
              shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_2a8);
            }
            else if (*posAtIgnore == *ifdefCount) {
              *ignoreifdef = false;
            }
          }
          else {
            lVar7 = std::__cxx11::string::find((char *)&lineCount,0x2726bc);
            if (lVar7 == 1) {
              if (*ifdefCount == 0) {
                std::make_shared<std::__cxx11::string,std::__cxx11::string&>(&local_2c8);
                sVar2 = local_268;
                std::shared_ptr<boost::filesystem::path>::shared_ptr
                          ((shared_ptr<boost::filesystem::path> *)&pos,path);
                BuilderExecutable::generateNotification
                          (&this->super_BuilderExecutable,err_endifWithoutIfdef,
                           (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_2c8,sVar2,(shared_ptr<boost::filesystem::path> *)&pos);
                std::shared_ptr<boost::filesystem::path>::~shared_ptr
                          ((shared_ptr<boost::filesystem::path> *)&pos);
                std::
                shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_2c8);
              }
              else {
                if (*posAtIgnore == *ifdefCount) {
                  *ignoreifdef = false;
                }
                *ifdefCount = *ifdefCount - 1;
              }
            }
          }
        }
      }
      else if ((*ignoreifdef & 1U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_840,"\r",&local_841);
        std::__cxx11::string::string((string *)&__range5);
        helper::replace<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lineCount,
                   &local_840,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range5);
        std::__cxx11::string::~string((string *)&__range5);
        std::__cxx11::string::~string((string *)&local_840);
        std::allocator<char>::~allocator((allocator<char> *)&local_841);
        std::__cxx11::string::operator+=((string *)&lineCount,'\n');
        __end5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::begin(definitions);
        s = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::end(definitions);
        while (bVar3 = std::operator!=(&__end5,(_Self *)&s), bVar3) {
          local_888 = std::
                      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator*(&__end5);
          helper::replace<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lineCount
                     ,&local_888->first,&local_888->second);
          std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator++(&__end5);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_8a8,"__FILE__",&local_8a9);
        peVar4 = std::
                 __shared_ptr_access<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)path);
        psVar5 = boost::filesystem::path::generic_string_abi_cxx11_(peVar4);
        helper::replace<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lineCount,
                   &local_8a8,psVar5);
        std::__cxx11::string::~string((string *)&local_8a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_8a9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_8d0,"__LINE__",&local_8d1);
        std::__cxx11::to_string(&local_8f8,local_268);
        helper::replace<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lineCount,
                   &local_8d0,&local_8f8);
        std::__cxx11::string::~string((string *)&local_8f8);
        std::__cxx11::string::~string((string *)&local_8d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_8d1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_918,"__TIME__",&local_919);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_940,"",&local_941);
        helper::replace<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lineCount,
                   &local_918,&local_940);
        std::__cxx11::string::~string((string *)&local_940);
        std::allocator<char>::~allocator((allocator<char> *)&local_941);
        std::__cxx11::string::~string((string *)&local_918);
        std::allocator<char>::~allocator((allocator<char> *)&local_919);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_968,"__DATE__",&local_969);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_990,"",&local_991);
        helper::replace<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lineCount,
                   &local_968,&local_990);
        std::__cxx11::string::~string((string *)&local_990);
        std::allocator<char>::~allocator((allocator<char> *)&local_991);
        std::__cxx11::string::~string((string *)&local_968);
        std::allocator<char>::~allocator((allocator<char> *)&local_969);
        std::make_shared<std::__cxx11::string,std::__cxx11::string&>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9d0);
        std::shared_ptr<boost::filesystem::path>::shared_ptr(&local_9e0,path);
        CodeBase::LineContent::LineContent
                  ((LineContent *)(local_9d0 + 0x10),
                   (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_9d0,&local_9e0,local_268);
        std::vector<nigel::CodeBase::LineContent,_std::allocator<nigel::CodeBase::LineContent>_>::
        push_back(result,(value_type *)(local_9d0 + 0x10));
        CodeBase::LineContent::~LineContent((LineContent *)(local_9d0 + 0x10));
        std::shared_ptr<boost::filesystem::path>::~shared_ptr(&local_9e0);
        std::
        shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_9d0);
      }
    }
  }
  std::__cxx11::string::~string((string *)&lineCount);
  std::ifstream::~ifstream((void *)((long)&str.field_2 + 8));
  return;
}

Assistant:

void Preprocessor::processFile( CodeBase &base, std::shared_ptr<fs::path> path, std::vector<CodeBase::LineContent> &result, std::map<String, String> &definitions, size_t &ifdefCount, bool &ignoreifdef, size_t &posAtIgnore )
	{
		std::ifstream filestream( path->string(), std::ios_base::binary );
		String str;
		size_t lineCount = 0;


		while( filestream && std::getline( filestream, str ) )
		{
			lineCount++;

			//Remove whitespaces
			while( str.size() > 0 && ( str[0] == ' ' || str[0] == '\t' || str[0] == '\r' || str[0] == '\n' ) ) str = str.substr( 1 );

			if( str.size() > 0 )
			{
				if( str[0] == '#' )
				{//Is pp directive
					if( str.size() > 1 )
					{
						if( ignoreifdef )
						{//Is ignoring

							if( str.find( "ifdef" ) == 1 || str.find( "ifndef" ) == 1 )
							{//ifdef/ifndef-directive
								ifdefCount++;
							}
							if( str.find( "elseif" ) == 1 )
							{//elseif-directive
								if( ifdefCount > 0 )
								{
									if( posAtIgnore == ifdefCount )
										ignoreifdef = false;
								}
								else generateNotification( NT::err_elseifWithoutIfdef, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str.find( "endif" ) == 1 )
							{//endif
								if( ifdefCount > 0 )
								{
									if( posAtIgnore == ifdefCount )
										ignoreifdef = false;
									ifdefCount--;
								}
								else generateNotification( NT::err_endifWithoutIfdef, std::make_shared<String>( str ), lineCount, path );
							}
						}
						else
						{
							if( str.find( "define" ) == 1 )
							{//define-directive
								if( str.size() > 8 )
								{
									size_t pos = str.find( '\n' );
									if( str.find( '\r' ) < pos ) pos = str.find( '\r' );
									if( str.find( ' ', 8 ) < pos ) pos = str.find( ' ', 8 );
									String identifier = str.substr( 8, pos - 8 );

									String def;
									if( str.size() > 9 + identifier.size() )
									{
										size_t pos = str.find( '\n' );
										if( str.find( '\r' ) < pos ) pos = str.find( '\r' );
										def = str.substr( 9 + identifier.size(), pos - 9 - identifier.size() );
									}
									definitions[identifier] = def;
								}
								else generateNotification( NT::err_incompleteDefineDirective, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str.find( "undef" ) == 1 )
							{//undef-directive
								if( str.size() > 7 )
								{
									size_t pos = str.find( '\n' );
									if( str.find( '\r' ) < pos ) pos = str.find( '\r' );
									String identifier = str.substr( 7, pos - 7 );
									if( definitions.find( identifier ) != definitions.end() ) definitions.erase( identifier );
									else generateNotification( NT::warn_undefinedIdentifiernAtUndefDirective, std::make_shared<String>( str ), lineCount, path );
								}
								else generateNotification( NT::err_incompleteUndefineDirective, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str.find( "ifdef" ) == 1 )
							{//ifdef-directive
								if( str.size() > 7 )
								{
									size_t pos = str.find( '\n' );
									if( str.find( '\r' ) < pos ) pos = str.find( '\r' );
									String identifier = str.substr( 7, pos - 7 );

									ifdefCount++;
									if( definitions.find( identifier ) == definitions.end() )
									{
										ignoreifdef = true;
										posAtIgnore = ifdefCount;
									}
								}
								else generateNotification( NT::err_elseifWithoutIfdef, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str.find( "ifndef" ) == 1 )
							{//ifndef-directive
								if( str.size() > 8 )
								{
									size_t pos = str.find( '\n' );
									if( str.find( '\r' ) < pos ) pos = str.find( '\r' );
									String identifier = str.substr( 8, pos - 8 );

									ifdefCount++;
									if( definitions.find( identifier ) != definitions.end() )
									{
										ignoreifdef = true;
										posAtIgnore = ifdefCount;
									}
								}
								else generateNotification( NT::err_elseifWithoutIfdef, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str.find( "elseif" ) == 1 )
							{//elseif-directive
								if( ifdefCount > 0 )
								{
									if( !ignoreifdef )
									{
										ignoreifdef = true;
										posAtIgnore = ifdefCount;
									}
									else ignoreifdef = false;
								}
								else generateNotification( NT::err_elseifWithoutIfdef, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str.find( "endif" ) == 1 )
							{//endif
								if( ifdefCount > 0 )
								{
									if( posAtIgnore == ifdefCount )
										ignoreifdef = false;
									ifdefCount--;
								}
								else generateNotification( NT::err_endifWithoutIfdef, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str.find( "error" ) == 1 )
							{//error
								size_t pos = str.find( '\n' );
								if( str.find( '\r' ) < pos ) pos = str.find( '\r' );
								String errorInfo = str.substr( 8, pos - 8 );

								generateNotification( NT::err_errorDirective, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str.find( "warning" ) == 1 )
							{//warning
								size_t pos = str.find( '\n' );
								if( str.find( '\r' ) < pos ) pos = str.find( '\r' );
								String errorInfo = str.substr( 8, pos - 8 );

								generateNotification( NT::warn_warningDirective, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str.find( "include" ) == 1 )
							{//include-directive
								if( str.size() > 10 )
								{
									String filename = str.substr( str.find( '\"', 9 ) + 1 );
									fs::path subPath = fs::path( filename.substr( 0, filename.find( '\"' ) ) );
									if( path->has_parent_path() ) subPath = fs::absolute( subPath, path->parent_path() );
									processFile( base, std::make_shared<fs::path>( subPath ), result, definitions, ifdefCount, ignoreifdef, posAtIgnore );
								}
								else generateNotification( NT::err_incompleteIncludeDirective, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str.find( "pragma" ) == 1 )
							{//pragma-directive
								if( str.size() > 8 )
								{
									size_t pos = str.find( '\n' );
									if( str.find( '\r' ) < pos ) pos = str.find( '\r' );
									if( str.find( ' ', 8 ) < pos ) pos = str.find( ' ', 8 );
									else if( str.find( '=', 8 ) < pos ) pos = str.find( '=', 8 );
									String identifier = str.substr( 8, pos - 8 );

									String def;
									if( str.size() > 9 + identifier.size() )
									{
										size_t pos = str.find( '\n' );
										if( str.find( '\r' ) < pos ) pos = str.find( '\r' );
										def = str.substr( 9 + identifier.size(), pos - 9 - identifier.size() );
									}

									if( identifier == "memmodel" )
									{
										if( def.empty() )
										{
											generateNotification( NT::err_incompleteMemModelPragma, std::make_shared<String>( str ), lineCount, path );
										}
										else if( def == "fast" )
										{
											definitions["byte"] = "fast byte";
											definitions["int"] = "fast int";
										}
										else if( def == "norm" )
										{
											definitions["byte"] = "norm byte";
											definitions["int"] = "norm int";
										}
										else generateNotification( NT::err_unknownMemModelPragma, std::make_shared<String>( str ), lineCount, path );
									}
									else generateNotification( NT::err_unknownPragma, std::make_shared<String>( str ), lineCount, path );
								}
								else generateNotification( NT::err_incompletePragma, std::make_shared<String>( str ), lineCount, path );
							}
							else if( str == "##" || str == "#\r" || str == "##\r" )
								generateNotification( NT::warn_emptyDirective, std::make_shared<String>( str ), lineCount, path );
							else generateNotification( NT::err_unknownDirective, std::make_shared<String>( str ), lineCount, path );
						}
					}
					else generateNotification( NT::warn_emptyDirective, std::make_shared<String>( str ), lineCount, path );
				}
				else
				{
					if( !ignoreifdef )
					{//Is not ignored
						//Remove obsolete carriage returns
						replace( str, String( "\r" ), String() );
						str += '\n';

						//Replace defined constructs
						for( auto &s : definitions )
						{//todo: should not be replaced in string literals!
							replace( str, s.first, s.second );
						}

						//Replace debuggable information
						replace( str, String( "__FILE__" ), path->generic_string() );
						replace( str, String( "__LINE__" ), to_string( lineCount ) );
						replace( str, String( "__TIME__" ), String( "" ) );//todo
						replace( str, String( "__DATE__" ), String( "" ) );//todo

						result.push_back( CodeBase::LineContent( std::make_shared<String>( str ), path, lineCount ) );
					}
				}
			}
		}
	}